

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_date_scanfn(arg_date *parent,char *argval)

{
  int iVar1;
  tm *ptVar2;
  tm *ptVar3;
  char *pcVar4;
  tm tm;
  
  iVar1 = parent->count;
  if (iVar1 == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) {
    parent->count = iVar1 + 1;
  }
  else {
    ptVar2 = parent->tmval;
    tm.tm_zone = ptVar2[iVar1].tm_zone;
    ptVar3 = ptVar2 + iVar1;
    tm.tm_sec = ptVar3->tm_sec;
    tm.tm_min = ptVar3->tm_min;
    tm.tm_hour = ptVar3->tm_hour;
    tm.tm_mday = ptVar3->tm_mday;
    ptVar3 = ptVar2 + iVar1;
    tm.tm_mon = ptVar3->tm_mon;
    tm.tm_year = ptVar3->tm_year;
    tm._24_8_ = *(undefined8 *)(&ptVar3->tm_mon + 2);
    ptVar2 = ptVar2 + iVar1;
    tm.tm_isdst = ptVar2->tm_isdst;
    tm._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
    tm.tm_gmtoff = *(long *)(&ptVar2->tm_isdst + 2);
    pcVar4 = arg_strptime(argval,parent->format,&tm);
    if (pcVar4 == (char *)0x0) {
      return 6;
    }
    if (*pcVar4 != '\0') {
      return 6;
    }
    ptVar3 = parent->tmval;
    iVar1 = parent->count;
    parent->count = iVar1 + 1;
    ptVar3[iVar1].tm_zone = tm.tm_zone;
    ptVar2 = ptVar3 + iVar1;
    ptVar2->tm_isdst = tm.tm_isdst;
    *(undefined4 *)&ptVar2->field_0x24 = tm._36_4_;
    *(long *)(&ptVar2->tm_isdst + 2) = tm.tm_gmtoff;
    ptVar2 = ptVar3 + iVar1;
    ptVar2->tm_mon = tm.tm_mon;
    ptVar2->tm_year = tm.tm_year;
    *(undefined8 *)(&ptVar2->tm_mon + 2) = tm._24_8_;
    ptVar3 = ptVar3 + iVar1;
    ptVar3->tm_sec = tm.tm_sec;
    ptVar3->tm_min = tm.tm_min;
    ptVar3->tm_hour = tm.tm_hour;
    ptVar3->tm_mday = tm.tm_mday;
  }
  return 0;
}

Assistant:

static int arg_date_scanfn(struct arg_date * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* no argument value was given, leave parent->tmval[] unaltered but still count it */
		parent->count++;
	} else {
		const char * pend;
		struct tm tm = parent->tmval[parent->count];

		/* parse the given argument value, store result in parent->tmval[] */
		pend = arg_strptime(argval, parent->format, &tm);

		if (pend && pend[0] == '\0') {
			parent->tmval[parent->count++] = tm;
		} else {
			errorcode = EBADDATE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}